

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O0

char * printAlias(MCInst *MI,SStream *OS)

{
  _Bool _Var1;
  uint OpNo;
  char *pcVar2;
  MCInst *in_RSI;
  MCInst *in_RDI;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  char *local_8;
  
  OpNo = MCInst_getOpcode(in_RDI);
  if (OpNo == 0xb5) {
    _Var1 = isReg((MCInst *)CONCAT44(0xb5,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                  in_stack_ffffffffffffffd8);
    if (_Var1) {
      local_8 = printAlias1((char *)in_RDI,in_RSI,OpNo,
                            (SStream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                           );
    }
    else {
      local_8 = (char *)0x0;
    }
  }
  else if (OpNo == 0xb9) {
    _Var1 = isReg((MCInst *)CONCAT44(0xb9,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                  in_stack_ffffffffffffffd8);
    if (_Var1) {
      local_8 = printAlias1((char *)in_RDI,in_RSI,OpNo,
                            (SStream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                           );
    }
    else {
      local_8 = (char *)0x0;
    }
  }
  else {
    if (OpNo != 0xce) {
      if (OpNo == 0xcf) {
        _Var1 = isReg((MCInst *)CONCAT44(0xcf,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                      in_stack_ffffffffffffffd8);
        if (!_Var1) {
          return (char *)0x0;
        }
        pcVar2 = printAlias2((char *)in_RDI,in_RSI,OpNo,in_stack_ffffffffffffffe0,
                             (SStream *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        return pcVar2;
      }
      if (OpNo != 0xd6) {
        if (OpNo == 0xdb) {
          _Var1 = isReg((MCInst *)CONCAT44(0xdb,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
                        ,in_stack_ffffffffffffffd8);
          if (!_Var1) {
            return (char *)0x0;
          }
          pcVar2 = printAlias1((char *)in_RDI,in_RSI,OpNo,
                               (SStream *)
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          return pcVar2;
        }
        if (OpNo == 0x111) {
          _Var1 = isReg((MCInst *)CONCAT44(0x111,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
          if (!_Var1) {
            return (char *)0x0;
          }
          pcVar2 = printAlias2((char *)in_RDI,in_RSI,OpNo,in_stack_ffffffffffffffe0,
                               (SStream *)
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          return pcVar2;
        }
        if (OpNo == 0x112) {
          _Var1 = isReg((MCInst *)CONCAT44(0x112,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
          if (!_Var1) {
            return (char *)0x0;
          }
          pcVar2 = printAlias2((char *)in_RDI,in_RSI,OpNo,in_stack_ffffffffffffffe0,
                               (SStream *)
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          return pcVar2;
        }
        if (OpNo != 0x379) {
          if (OpNo == 0x37b) {
            _Var1 = isReg((MCInst *)CONCAT44(0x37b,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
            if (!_Var1) {
              return (char *)0x0;
            }
            pcVar2 = printAlias1((char *)in_RDI,in_RSI,OpNo,
                                 (SStream *)
                                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
            return pcVar2;
          }
          if (OpNo != 0x4fa) {
            if (OpNo == 0x4fb) {
              _Var1 = isReg((MCInst *)CONCAT44(0x4fb,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
              if (!_Var1) {
                return (char *)0x0;
              }
              pcVar2 = printAlias2((char *)in_RDI,in_RSI,OpNo,in_stack_ffffffffffffffe0,
                                   (SStream *)
                                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
              return pcVar2;
            }
            if (OpNo != 0x4fd) {
              if (OpNo != 0x505) {
                return (char *)0x0;
              }
              _Var1 = isReg((MCInst *)CONCAT44(0x505,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
              if (!_Var1) {
                return (char *)0x0;
              }
              pcVar2 = printAlias2((char *)in_RDI,in_RSI,OpNo,in_stack_ffffffffffffffe0,
                                   (SStream *)
                                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
              return pcVar2;
            }
          }
          _Var1 = isReg((MCInst *)CONCAT44(OpNo,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
                        ,in_stack_ffffffffffffffd8);
          if (!_Var1) {
            return (char *)0x0;
          }
          pcVar2 = printAlias2((char *)in_RDI,in_RSI,OpNo,in_stack_ffffffffffffffe0,
                               (SStream *)
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          return pcVar2;
        }
        _Var1 = isReg((MCInst *)CONCAT44(0x379,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                      in_stack_ffffffffffffffd8);
        if (!_Var1) {
          return (char *)0x0;
        }
        pcVar2 = printAlias1((char *)in_RDI,in_RSI,OpNo,
                             (SStream *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        return pcVar2;
      }
    }
    _Var1 = isReg((MCInst *)CONCAT44(OpNo,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                  in_stack_ffffffffffffffd8);
    if ((_Var1) &&
       (_Var1 = isReg((MCInst *)CONCAT44(OpNo,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                      in_stack_ffffffffffffffd8), _Var1)) {
      local_8 = printAlias1((char *)in_RDI,in_RSI,OpNo,
                            (SStream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                           );
    }
    else {
      _Var1 = isReg((MCInst *)CONCAT44(OpNo,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                    in_stack_ffffffffffffffd8);
      if (_Var1) {
        local_8 = printAlias2((char *)in_RDI,in_RSI,OpNo,in_stack_ffffffffffffffe0,
                              (SStream *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      }
      else {
        local_8 = (char *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

static char *printAlias(MCInst *MI, SStream *OS)
{
	switch (MCInst_getOpcode(MI)) {
		case Mips_BEQ:
		case Mips_BEQ_MM:
			// beq $zero, $zero, $L2 => b $L2
			// beq $r0, $zero, $L2 => beqz $r0, $L2
			if (isReg(MI, 0, Mips_ZERO) && isReg(MI, 1, Mips_ZERO))
				return printAlias1("b", MI, 2, OS);
			if (isReg(MI, 1, Mips_ZERO))
				return printAlias2("beqz", MI, 0, 2, OS);
			return NULL;
		case Mips_BEQ64:
			// beq $r0, $zero, $L2 => beqz $r0, $L2
			if (isReg(MI, 1, Mips_ZERO_64))
				return printAlias2("beqz", MI, 0, 2, OS);
			return NULL;
		case Mips_BNE:
			// bne $r0, $zero, $L2 => bnez $r0, $L2
			if (isReg(MI, 1, Mips_ZERO))
				return printAlias2("bnez", MI, 0, 2, OS);
			return NULL;
		case Mips_BNE64:
			// bne $r0, $zero, $L2 => bnez $r0, $L2
			if (isReg(MI, 1, Mips_ZERO_64))
				return printAlias2("bnez", MI, 0, 2, OS);
			return NULL;
		case Mips_BGEZAL:
			// bgezal $zero, $L1 => bal $L1
			if (isReg(MI, 0, Mips_ZERO))
				return printAlias1("bal", MI, 1, OS);
			return NULL;
		case Mips_BC1T:
			// bc1t $fcc0, $L1 => bc1t $L1
			if (isReg(MI, 0, Mips_FCC0))
				return printAlias1("bc1t", MI, 1, OS);
			return NULL;
		case Mips_BC1F:
			// bc1f $fcc0, $L1 => bc1f $L1
			if (isReg(MI, 0, Mips_FCC0))
				return printAlias1("bc1f", MI, 1, OS);
			return NULL;
		case Mips_JALR:
			// jalr $ra, $r1 => jalr $r1
			if (isReg(MI, 0, Mips_RA))
				return printAlias1("jalr", MI, 1, OS);
			return NULL;
		case Mips_JALR64:
			// jalr $ra, $r1 => jalr $r1
			if (isReg(MI, 0, Mips_RA_64))
				return printAlias1("jalr", MI, 1, OS);
			return NULL;
		case Mips_NOR:
		case Mips_NOR_MM:
			// nor $r0, $r1, $zero => not $r0, $r1
			if (isReg(MI, 2, Mips_ZERO))
				return printAlias2("not", MI, 0, 1, OS);
			return NULL;
		case Mips_NOR64:
			// nor $r0, $r1, $zero => not $r0, $r1
			if (isReg(MI, 2, Mips_ZERO_64))
				return printAlias2("not", MI, 0, 1, OS);
			return NULL;
		case Mips_OR:
			// or $r0, $r1, $zero => move $r0, $r1
			if (isReg(MI, 2, Mips_ZERO))
				return printAlias2("move", MI, 0, 1, OS);
			return NULL;
		default: return NULL;
	}
}